

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::type_caster<double,_void>::load
          (type_caster<double,_void> *this,handle src,bool convert)

{
  bool bVar1;
  int iVar2;
  PyObject **ppPVar3;
  long lVar4;
  PyObject *ptr;
  double dVar5;
  bool local_6a;
  bool local_69;
  handle local_48;
  handle local_40;
  object tmp;
  bool type_error;
  bool py_err;
  py_type py_value;
  bool convert_local;
  type_caster<double,_void> *this_local;
  handle src_local;
  
  this_local = (type_caster<double,_void> *)src.m_ptr;
  bVar1 = handle::operator_cast_to_bool((handle *)&this_local);
  if (bVar1) {
    if (!convert) {
      ppPVar3 = handle::ptr((handle *)&this_local);
      iVar2 = _PyObject_TypeCheck(*ppPVar3,(PyTypeObject *)&PyFloat_Type);
      if (iVar2 == 0) {
        src_local.m_ptr._7_1_ = 0;
        goto LAB_00139e6c;
      }
    }
    ppPVar3 = handle::ptr((handle *)&this_local);
    dVar5 = (double)PyFloat_AsDouble(*ppPVar3);
    local_69 = false;
    if ((dVar5 == -1.0) && (!NAN(dVar5))) {
      lVar4 = PyErr_Occurred();
      local_69 = lVar4 != 0;
    }
    tmp.super_handle.m_ptr._7_1_ = local_69;
    if (local_69 == false) {
      this->value = dVar5;
      src_local.m_ptr._7_1_ = 1;
    }
    else {
      local_6a = false;
      if (local_69 != false) {
        iVar2 = PyErr_ExceptionMatches(_PyExc_TypeError);
        local_6a = iVar2 != 0;
      }
      tmp.super_handle.m_ptr._6_1_ = local_6a;
      PyErr_Clear();
      if (((tmp.super_handle.m_ptr._6_1_ & 1) != 0) && (convert)) {
        ppPVar3 = handle::ptr((handle *)&this_local);
        iVar2 = PyNumber_Check(*ppPVar3);
        if (iVar2 != 0) {
          ppPVar3 = handle::ptr((handle *)&this_local);
          ptr = (PyObject *)PyNumber_Float(*ppPVar3);
          handle::handle(&local_48,ptr);
          reinterpret_steal<pybind11::object>((pybind11 *)&local_40,local_48);
          PyErr_Clear();
          src_local.m_ptr._7_1_ = load(this,local_40,false);
          object::~object((object *)&local_40);
          goto LAB_00139e6c;
        }
      }
      src_local.m_ptr._7_1_ = 0;
    }
  }
  else {
    src_local.m_ptr._7_1_ = 0;
  }
LAB_00139e6c:
  return (bool)(src_local.m_ptr._7_1_ & 1);
}

Assistant:

bool load(handle src, bool convert) {
        py_type py_value;

        if (!src)
            return false;

        if (std::is_floating_point<T>::value) {
            if (convert || PyFloat_Check(src.ptr()))
                py_value = (py_type) PyFloat_AsDouble(src.ptr());
            else
                return false;
        } else if (PyFloat_Check(src.ptr())) {
            return false;
        } else if (std::is_unsigned<py_type>::value) {
            py_value = as_unsigned<py_type>(src.ptr());
        } else { // signed integer:
            py_value = sizeof(T) <= sizeof(long)
                ? (py_type) PyLong_AsLong(src.ptr())
                : (py_type) PYBIND11_LONG_AS_LONGLONG(src.ptr());
        }

        bool py_err = py_value == (py_type) -1 && PyErr_Occurred();

        // Protect std::numeric_limits::min/max with parentheses
        if (py_err || (std::is_integral<T>::value && sizeof(py_type) != sizeof(T) &&
                       (py_value < (py_type) (std::numeric_limits<T>::min)() ||
                        py_value > (py_type) (std::numeric_limits<T>::max)()))) {
            bool type_error = py_err && PyErr_ExceptionMatches(
#if PY_VERSION_HEX < 0x03000000 && !defined(PYPY_VERSION)
                PyExc_SystemError
#else
                PyExc_TypeError
#endif
            );
            PyErr_Clear();
            if (type_error && convert && PyNumber_Check(src.ptr())) {
                auto tmp = reinterpret_steal<object>(std::is_floating_point<T>::value
                                                     ? PyNumber_Float(src.ptr())
                                                     : PyNumber_Long(src.ptr()));
                PyErr_Clear();
                return load(tmp, false);
            }
            return false;
        }

        value = (T) py_value;
        return true;
    }